

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URI.cpp
# Opt level: O2

String * __thiscall
stick::URI::decode(String *__return_storage_ptr__,URI *this,String *_str,Error *_error)

{
  char cVar1;
  char _args;
  int iVar2;
  Allocator *pAVar3;
  char *pcVar4;
  int *piVar5;
  long lVar6;
  undefined8 extraout_RAX;
  char _args_1;
  String *this_00;
  UInt32 _line;
  char *pcVar8;
  Error local_d8;
  String local_80;
  undefined1 local_60 [8];
  String tmp2;
  char *pcVar7;
  char *pcVar9;
  
  pAVar3 = defaultAllocator();
  __return_storage_ptr__->m_cStr = (char *)0x0;
  __return_storage_ptr__->m_length = 0;
  __return_storage_ptr__->m_capacity = 0;
  __return_storage_ptr__->m_allocator = pAVar3;
  String::reserve(__return_storage_ptr__,0x80);
  pcVar4 = _str->m_cStr;
  tmp2.m_allocator = (Allocator *)0x0;
  pcVar8 = pcVar4;
  while( true ) {
    pcVar4 = pcVar4 + _str->m_length;
    if (pcVar8 == pcVar4) {
      return __return_storage_ptr__;
    }
    if (*pcVar8 == '%') break;
    String::append(__return_storage_ptr__,*pcVar8);
    pcVar9 = pcVar8;
LAB_001136cc:
    pcVar8 = pcVar9 + 1;
    pcVar4 = _str->m_cStr;
  }
  pcVar7 = pcVar8 + 1;
  if (pcVar7 == pcVar4) {
    pAVar3 = defaultAllocator();
    String::String((String *)local_60,"Two hex digits have to follow the percent sign!",pAVar3);
    _line = 0x138;
  }
  else {
    pcVar9 = pcVar8 + 2;
    if (pcVar9 == pcVar4) {
      pAVar3 = defaultAllocator();
      String::String((String *)local_60,"Two hex digits have to follow the percent sign!",pAVar3);
      _line = 0x144;
    }
    else {
      cVar1 = pcVar8[1];
      _args = *pcVar9;
      iVar2 = isxdigit((int)cVar1);
      _args_1 = (char)pcVar7;
      if ((iVar2 != 0) && (iVar2 = isxdigit((int)_args), iVar2 != 0)) {
        String::concat<char,char>
                  ((String *)local_60,(String *)(ulong)(uint)(int)cVar1,_args,_args_1);
        piVar5 = __errno_location();
        *piVar5 = 0;
        lVar6 = strtol((char *)local_60,(char **)0x0,0x10);
        iVar2 = *piVar5;
        if (iVar2 == 0) {
          String::append(__return_storage_ptr__,(char)lVar6);
        }
        else {
          pAVar3 = defaultAllocator();
          String::String(&local_80,"Error extracting char from hex digits!",pAVar3);
          Error::Error<stick::ec::MiscErrorCode>
                    (&local_d8,BadURI,&local_80,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/mokafolio[P]Stick/Stick/URI.cpp"
                     ,0x159,(type *)0x0);
          Error::operator=(_error,&local_d8);
          Error::~Error(&local_d8);
          String::deallocate(&local_80);
          tmp2.m_allocator = (Allocator *)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
        }
        String::deallocate((String *)local_60);
        if (iVar2 != 0) {
          this_00 = __return_storage_ptr__;
          if (((ulong)tmp2.m_allocator & 1) != 0) {
            return __return_storage_ptr__;
          }
          goto LAB_001137a2;
        }
        goto LAB_001136cc;
      }
      pAVar3 = defaultAllocator();
      String::String((String *)local_60,"The high or low digit is not a valid hex digit!",pAVar3);
      _line = 0x14f;
    }
  }
  Error::Error<stick::ec::MiscErrorCode>
            (&local_d8,BadURI,(String *)local_60,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mokafolio[P]Stick/Stick/URI.cpp"
             ,_line,(type *)0x0);
  Error::operator=(_error,&local_d8);
  Error::~Error(&local_d8);
  this_00 = (String *)local_60;
LAB_001137a2:
  String::deallocate(this_00);
  return __return_storage_ptr__;
}

Assistant:

String URI::decode(const String & _str, Error & _error) const
{
    String ret;
    ret.reserve(128);
    String::ConstIter it = _str.begin();
    for (; it != _str.end(); ++it)
    {
        char c = *it;
        Int64 tmp;
        if (c == '%')
        {
            // std::stringstream strstr;
            it++;
            if (it == _str.end())
            {
                _error = Error(ec::BadURI,
                               "Two hex digits have to follow the percent sign!",
                               STICK_FILE,
                               STICK_LINE);
                return ret;
            }

            char hi = *it;
            it++;

            if (it == _str.end())
            {
                _error = Error(ec::BadURI,
                               "Two hex digits have to follow the percent sign!",
                               STICK_FILE,
                               STICK_LINE);
                return ret;
            }

            char lo = *it;

            if (!isxdigit(hi) || !isxdigit(lo))
            {
                _error = Error(ec::BadURI,
                               "The high or low digit is not a valid hex digit!",
                               STICK_FILE,
                               STICK_LINE);
                return ret;
            }

            String tmp2 = String::concat(hi, lo);
            errno = 0;
            tmp = strtol(tmp2.cString(), NULL, 16);
            if (errno != 0)
            {
                _error = Error(
                    ec::BadURI, "Error extracting char from hex digits!", STICK_FILE, STICK_LINE);
                return ret;
            }
            ret.append((char)tmp);
        }
        else
        {
            ret.append(*it);
        }
    }

    return ret;
}